

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

DReachabilityPropagator *
dreachable(int r,vec<BoolView> *_vs,vec<BoolView> *_es,vec<vec<int>_> *_in,vec<vec<int>_> *_out,
          vec<vec<int>_> *_en,BoolView *b)

{
  DReachabilityPropagator *pDVar1;
  undefined8 in_RCX;
  int _r;
  vec<BoolView> *in_RDX;
  vec<BoolView> *in_RSI;
  undefined4 in_EDI;
  DReachabilityPropagatorReif *in_R8;
  DReachabilityPropagator *dr;
  BoolView *in_stack_ffffffffffffff48;
  BoolView *in_stack_ffffffffffffff50;
  DReachabilityPropagator *_out_00;
  undefined4 in_stack_ffffffffffffff80;
  vec<vec<int>_> *in_stack_ffffffffffffffb0;
  BoolView *in_stack_ffffffffffffffb8;
  
  _r = (int)((ulong)in_RCX >> 0x20);
  pDVar1 = (DReachabilityPropagator *)operator_new(0x1d8);
  _out_00 = pDVar1;
  BoolView::BoolView(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  DReachabilityPropagatorReif::DReachabilityPropagatorReif
            (in_R8,_r,in_RDX,in_RSI,(vec<vec<int>_> *)CONCAT44(in_EDI,in_stack_ffffffffffffff80),
             (vec<vec<int>_> *)_out_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  BoolView::~BoolView((BoolView *)0x2b1a03);
  return pDVar1;
}

Assistant:

DReachabilityPropagator* dreachable(int r, vec<BoolView>& _vs, vec<BoolView>& _es,
																		vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																		vec<vec<int> >& _en, BoolView b) {
	DReachabilityPropagator* dr =
			new DReachabilityPropagatorReif(r, _vs, _es, _in, _out, _en, std::move(b));
	// if (so.check_prop)
	//     engine.propagators.push(dr);
	return dr;
}